

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O1

void __thiscall
llama_model_loader::get_mapping_range
          (llama_model_loader *this,size_t *first,size_t *last,void **addr,int idx,ggml_context *ctx
          )

{
  pointer puVar1;
  pointer puVar2;
  size_t sVar3;
  void *pvVar4;
  long lVar5;
  char *name;
  llama_tensor_weight *plVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  puVar1 = (this->mappings).
           super__Vector_base<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->mappings).
           super__Vector_base<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar1 == puVar2) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model-loader.cpp"
               ,0x34d,"GGML_ASSERT(%s) failed","!mappings.empty()");
  }
  uVar9 = (ulong)idx;
  if (uVar9 < (ulong)((long)puVar2 - (long)puVar1 >> 3)) {
    sVar3 = llama_mmap::size(puVar1[uVar9]._M_t.
                             super___uniq_ptr_impl<llama_mmap,_std::default_delete<llama_mmap>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_llama_mmap_*,_std::default_delete<llama_mmap>_>.
                             super__Head_base<0UL,_llama_mmap_*,_false>._M_head_impl);
    *first = sVar3;
    *last = 0;
    pvVar4 = llama_mmap::addr(puVar1[uVar9]._M_t.
                              super___uniq_ptr_impl<llama_mmap,_std::default_delete<llama_mmap>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_llama_mmap_*,_std::default_delete<llama_mmap>_>
                              .super__Head_base<0UL,_llama_mmap_*,_false>._M_head_impl);
    *addr = pvVar4;
    for (lVar5 = ggml_get_first_tensor(ctx); lVar5 != 0; lVar5 = ggml_get_next_tensor(ctx,lVar5)) {
      name = (char *)ggml_get_name(lVar5);
      plVar6 = get_weight(this,name);
      if ((plVar6 != (llama_tensor_weight *)0x0) && ((uint)plVar6->idx == idx)) {
        uVar9 = plVar6->offs;
        if (*first <= plVar6->offs) {
          uVar9 = *first;
        }
        *first = uVar9;
        sVar3 = plVar6->offs;
        lVar7 = ggml_nbytes(lVar5);
        uVar8 = lVar7 + sVar3;
        uVar9 = *last;
        if (*last <= uVar8) {
          uVar9 = uVar8;
        }
        *last = uVar9;
      }
    }
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9);
}

Assistant:

void llama_model_loader::get_mapping_range(size_t * first, size_t * last, void ** addr, int idx, ggml_context * ctx) const {
    GGML_ASSERT(!mappings.empty());
    const auto & mapping = mappings.at(idx);

    *first = mapping->size();
    *last  = 0;
    *addr = mapping->addr();
    for (ggml_tensor * tensor = ggml_get_first_tensor(ctx); tensor; tensor = ggml_get_next_tensor(ctx, tensor)) {
        const auto * weight = get_weight(ggml_get_name(tensor));
        if (!weight || weight->idx != idx) {
            continue;
        }
        *first = std::min(*first, weight->offs);
        *last  = std::max(*last,  weight->offs + ggml_nbytes(tensor));
    }
}